

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O0

void duckdb::Prefix::Concat
               (ART *art,Node *parent,uint8_t byte,GateStatus old_status,Node *child,
               GateStatus status)

{
  GateStatus GVar1;
  NType NVar2;
  char in_CL;
  IndexPointer in_R8;
  char in_R9B;
  Prefix tail;
  Prefix prefix;
  row_t row_id;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  Node *in_stack_ffffffffffffff70;
  undefined8 *local_78;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  Node *in_stack_ffffffffffffff98;
  ART *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  ART *in_stack_ffffffffffffffb0;
  Node *in_stack_ffffffffffffffb8;
  NType in_stack_ffffffffffffffc0;
  undefined6 uStack_3f;
  uint8_t in_stack_ffffffffffffffc7;
  Node *in_stack_ffffffffffffffc8;
  ART *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  
  if (in_CL == '\x01') {
    ConcatGate((ART *)in_R8.data,(Node *)CONCAT17(in_R9B,in_stack_ffffffffffffffd8),
               (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38),in_stack_ffffffffffffffc8);
  }
  else {
    GVar1 = Node::GetGateStatus(in_stack_ffffffffffffff70);
    if (GVar1 == GATE_SET) {
      ConcatChildIsGate(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffc7,in_stack_ffffffffffffffb8);
    }
    else if ((in_R9B == '\x01') && (NVar2 = Node::GetType((Node *)0x18d2a2c), NVar2 == LEAF_INLINED)
            ) {
      Node::GetRowId((Node *)0x18d2a3a);
      Free(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      Leaf::New(in_stack_ffffffffffffff70,
                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    else {
      NVar2 = Node::GetType((Node *)0x18d2a78);
      if (NVar2 == PREFIX) {
        GetTail(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        Append((Prefix *)in_R8.data,(ART *)CONCAT17(in_R9B,in_stack_ffffffffffffffd8),
               (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38));
        NVar2 = Node::GetType((Node *)0x18d2b58);
        if (NVar2 == PREFIX) {
          Append((Prefix *)CONCAT17(in_R9B,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
                 (Node)in_R8.data);
        }
        else {
          *local_78 = *(undefined8 *)in_R8.data;
        }
      }
      else {
        NewInternal(in_stack_ffffffffffffffb0,
                    (Node *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8),
                    (data_ptr_t)in_stack_ffffffffffffffa0,
                    (uint8_t)((ulong)in_stack_ffffffffffffff98 >> 0x38),
                    CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffffc0);
        NVar2 = Node::GetType((Node *)0x18d2aba);
        if (NVar2 == PREFIX) {
          Append((Prefix *)CONCAT17(in_R9B,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
                 (Node)in_R8.data);
        }
        else {
          *(undefined8 *)
           CONCAT17(in_stack_ffffffffffffffc7,CONCAT61(uStack_3f,in_stack_ffffffffffffffc0)) =
               *(undefined8 *)in_R8.data;
        }
      }
    }
  }
  return;
}

Assistant:

void Prefix::Concat(ART &art, Node &parent, uint8_t byte, const GateStatus old_status, const Node &child,
                    const GateStatus status) {
	D_ASSERT(!parent.IsAnyLeaf());
	D_ASSERT(child.HasMetadata());

	if (old_status == GateStatus::GATE_SET) {
		// Concat Node4.
		D_ASSERT(status == GateStatus::GATE_SET);
		return ConcatGate(art, parent, byte, child);
	}
	if (child.GetGateStatus() == GateStatus::GATE_SET) {
		// Concat Node4.
		D_ASSERT(status == GateStatus::GATE_NOT_SET);
		return ConcatChildIsGate(art, parent, byte, child);
	}

	if (status == GateStatus::GATE_SET && child.GetType() == NType::LEAF_INLINED) {
		auto row_id = child.GetRowId();
		Free(art, parent);
		Leaf::New(parent, row_id);
		return;
	}

	if (parent.GetType() != PREFIX) {
		auto prefix = NewInternal(art, parent, &byte, 1, 0, PREFIX);
		if (child.GetType() == PREFIX) {
			prefix.Append(art, child);
		} else {
			*prefix.ptr = child;
		}
		return;
	}

	auto tail = GetTail(art, parent);
	tail = tail.Append(art, byte);

	if (child.GetType() == PREFIX) {
		tail.Append(art, child);
	} else {
		*tail.ptr = child;
	}
}